

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_scanner.h
# Opt level: O1

void __thiscall CMakeScanner::~CMakeScanner(CMakeScanner *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if ((FILE *)this->file != (FILE *)0x0) {
    fclose((FILE *)this->file);
  }
  if (this->stringBuf != (YY_BUFFER_STATE)0x0) {
    yy_delete_buffer(this->stringBuf,this->yyscanner);
  }
  yylex_destroy(this->yyscanner);
  pcVar1 = (this->scannerCtx).filepath._M_dataplus._M_p;
  paVar2 = &(this->scannerCtx).filepath.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  yy::parser::basic_symbol<yy::parser::by_kind>::~basic_symbol
            (&(this->scannerCtx).nextToken.super_basic_symbol<yy::parser::by_kind>);
  pcVar1 = (this->scannerCtx).stringLiteral.literal._M_dataplus._M_p;
  paVar2 = &(this->scannerCtx).stringLiteral.literal.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~CMakeScanner()
    {
        if(file)
        {
            fclose(file);
        }

        if(stringBuf)
        {
            yy_delete_buffer(stringBuf, yyscanner);
        }

        yylex_destroy(yyscanner);
    }